

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp-tests.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_58bb::Util_addTwo_Test::TestBody(Util_addTwo_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_c0;
  Message local_b8;
  int local_b0;
  int local_ac;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar_3;
  Message local_90;
  int local_88;
  int local_84;
  undefined1 local_80 [8];
  AssertionResult gtest_ar_2;
  Message local_68;
  int local_60;
  int local_5c;
  undefined1 local_58 [8];
  AssertionResult gtest_ar_1;
  Message local_40 [3];
  int local_28;
  int local_24;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  Util_addTwo_Test *this_local;
  
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
  ;
  local_24 = Util::addTwo(1,2);
  local_28 = 3;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_20,"Util::addTwo(1, 2)","3",&local_24,&local_28);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_40);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/DanRuta[P]webassembly-workflow/test/cpp-tests.cpp"
               ,0x1d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  local_5c = Util::addTwo(3,2);
  local_60 = 5;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_58,"Util::addTwo(3, 2)","5",&local_5c,&local_60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_58);
  if (!bVar1) {
    testing::Message::Message(&local_68);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_58);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/DanRuta[P]webassembly-workflow/test/cpp-tests.cpp"
               ,0x1e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_58);
  local_84 = Util::addTwo(-3,2);
  local_88 = -1;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_80,"Util::addTwo(-3, 2)","-1",&local_84,&local_88);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(&local_90);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/DanRuta[P]webassembly-workflow/test/cpp-tests.cpp"
               ,0x1f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  local_ac = Util::addTwo(-3,0);
  local_b0 = -3;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_a8,"Util::addTwo(-3, 0)","-3",&local_ac,&local_b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/DanRuta[P]webassembly-workflow/test/cpp-tests.cpp"
               ,0x20,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  return;
}

Assistant:

TEST(Util, addTwo) {
        EXPECT_EQ(Util::addTwo(1, 2), 3);
        EXPECT_EQ(Util::addTwo(3, 2), 5);
        EXPECT_EQ(Util::addTwo(-3, 2), -1);
        EXPECT_EQ(Util::addTwo(-3, 0), -3);
    }